

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

void __thiscall wallet::CCoinControl::CCoinControl(CCoinControl *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  FlatSigningProvider *in_stack_ffffffffffffff48;
  ArgsManager *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  allocator<char> local_49 [33];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  CNoDestination::CNoDestination((CNoDestination *)in_stack_ffffffffffffff48);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<CNoDestination,void,void,CNoDestination,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             (CNoDestination *)in_stack_ffffffffffffff50);
  CNoDestination::~CNoDestination((CNoDestination *)in_stack_ffffffffffffff48);
  std::optional<OutputType>::optional((optional<OutputType> *)in_stack_ffffffffffffff48);
  *(undefined1 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)(in_RDI + 0x59) = 1;
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  *(undefined1 *)(in_RDI + 0x5b) = 0;
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)in_stack_ffffffffffffff48);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_stack_ffffffffffffff48);
  std::optional<bool>::optional((optional<bool> *)in_stack_ffffffffffffff48);
  *(undefined1 *)(in_RDI + 0x7a) = 0;
  *(undefined1 *)(in_RDI + 0x7b) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0x84) = 9999999;
  FlatSigningProvider::FlatSigningProvider(in_stack_ffffffffffffff48);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_stack_ffffffffffffff48);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_stack_ffffffffffffff48);
  std::optional<int>::optional((optional<int> *)(in_RDI + 400));
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::map((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
         *)in_stack_ffffffffffffff48);
  *(undefined4 *)(in_RDI + 0x1c8) = 0;
  __a = local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__a);
  bVar1 = ArgsManager::GetBoolArg
                    (in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48,
                     (bool)in_stack_ffffffffffffff5f);
  *(bool *)(in_RDI + 0x7a) = bVar1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff48);
  std::allocator<char>::~allocator(local_49);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinControl::CCoinControl()
{
    m_avoid_partial_spends = gArgs.GetBoolArg("-avoidpartialspends", DEFAULT_AVOIDPARTIALSPENDS);
}